

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int lat_fwd_bwd(s3lattice_t *lat)

{
  double dVar1;
  bool bVar2;
  s3arc_s *psVar3;
  uint uVar4;
  s3arc_s *psVar5;
  uint uVar6;
  float64 *pfVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  float64 fVar12;
  float64 fVar13;
  double dVar14;
  
  uVar6 = lat->n_arcs;
  if (uVar6 != 0) {
    uVar10 = 0;
    do {
      psVar3 = lat->arc;
      psVar3[uVar10].alpha = -10000000000.0;
      if (psVar3[uVar10].good_arc == 1) {
        dVar14 = (double)psVar3[uVar10].lm_score;
        dVar11 = (double)(float)lm_scale;
        dVar1 = (double)psVar3[uVar10].ac_score;
        psVar3 = lat->arc;
        if (psVar3[uVar10].n_prev_arcs != 0) {
          uVar9 = 0;
          do {
            if (psVar3[uVar10].prev_arcs[uVar9] == 0) {
              if (psVar3[uVar10].sf == 1) {
                fVar12 = psVar3[uVar10].alpha;
                fVar13 = 0.0;
                goto LAB_001097ec;
              }
            }
            else {
              uVar6 = psVar3[uVar10].prev_arcs[uVar9] - 1;
              if (psVar3[uVar6].good_arc == 1) {
                fVar12 = psVar3[uVar10].alpha;
                fVar13 = psVar3[uVar6].alpha;
LAB_001097ec:
                fVar12 = log_add(fVar12,fVar13);
                lat->arc[uVar10].alpha = fVar12;
              }
            }
            uVar9 = uVar9 + 1;
            psVar3 = lat->arc;
          } while (uVar9 < psVar3[uVar10].n_prev_arcs);
        }
        psVar3[uVar10].alpha = (float64)(dVar14 + dVar1 / dVar11 + (double)psVar3[uVar10].alpha);
      }
      uVar10 = uVar10 + 1;
      uVar6 = lat->n_arcs;
    } while (uVar10 < uVar6);
  }
  lat->prob = -10000000000.0;
  if (-1 < (int)(uVar6 - 1)) {
    uVar10 = (ulong)(uVar6 - 1);
    do {
      psVar3 = lat->arc;
      psVar3[uVar10].beta = -10000000000.0;
      if (psVar3[uVar10].good_arc == 1) {
        dVar14 = (double)psVar3[uVar10].lm_score;
        dVar1 = (double)psVar3[uVar10].ac_score;
        dVar11 = (double)(float)lm_scale;
        psVar5 = lat->arc;
        psVar3 = psVar5 + uVar10;
        if (psVar5[uVar10].n_next_arcs != 0) {
          uVar9 = 0;
          do {
            if (psVar3->next_arcs[uVar9] == 0) {
              fVar12 = psVar3->beta;
              fVar13 = 0.0;
            }
            else {
              fVar12 = psVar3->beta;
              fVar13 = psVar5[psVar3->next_arcs[uVar9] - 1].beta;
            }
            fVar12 = log_add(fVar12,fVar13);
            psVar5 = lat->arc;
            psVar3 = psVar5 + uVar10;
            psVar5[uVar10].beta = fVar12;
            uVar9 = uVar9 + 1;
          } while (uVar9 < psVar5[uVar10].n_next_arcs);
        }
        dVar14 = dVar14 + dVar1 / dVar11 + (double)psVar3->beta;
        psVar3->beta = (float64)dVar14;
        if (psVar3->sf == 1) {
          fVar12 = log_add(lat->prob,(float64)dVar14);
          lat->prob = fVar12;
        }
      }
      bVar2 = 0 < (long)uVar10;
      uVar10 = uVar10 - 1;
    } while (bVar2);
  }
  uVar6 = lat->n_arcs;
  if ((ulong)uVar6 != 0) {
    psVar3 = lat->arc;
    dVar14 = (double)(float)lm_scale;
    lVar8 = 0;
    do {
      *(undefined8 *)((long)&psVar3->gamma + lVar8) = 0xc202a05f20000000;
      if (*(int *)((long)&psVar3->good_arc + lVar8) == 1) {
        *(double *)((long)&psVar3->gamma + lVar8) =
             (*(double *)((long)&psVar3->alpha + lVar8) + *(double *)((long)&psVar3->beta + lVar8))
             - (*(double *)((long)&psVar3->ac_score + lVar8) / dVar14 +
                *(double *)((long)&psVar3->lm_score + lVar8) + (double)lat->prob);
      }
      lVar8 = lVar8 + 0xd8;
    } while ((ulong)uVar6 * 0xd8 - lVar8 != 0);
  }
  lat->postprob = 0.0;
  uVar4 = uVar6 - lat->n_true_arcs;
  if (uVar4 < uVar6) {
    fVar12 = lat->postprob;
    pfVar7 = &lat->arc[(int)uVar4].gamma;
    do {
      fVar12 = (float64)((double)fVar12 + (double)*pfVar7);
      pfVar7 = pfVar7 + 0x1b;
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar6);
    lat->postprob = fVar12;
  }
  return 0;
}

Assistant:

int
lat_fwd_bwd(s3lattice_t *lat)
{
  int i, j;
  uint32 id;
  float64 ac_score, lm_score;

  /* step forward */
  for (i=0; i<lat->n_arcs; i++) {
    /* initialise alpha */
    lat->arc[i].alpha = LOG_ZERO;
    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute alpha */
      for (j=0; j<lat->arc[i].n_prev_arcs; j++) {
	id = lat->arc[i].prev_arcs[j];
	if (id == 0) {
	  if (lat->arc[i].sf == 1) {
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, 0);
	  }
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
	    lat->arc[i].alpha = log_add(lat->arc[i].alpha, lat->arc[id-1].alpha);
	}
      }
      lat->arc[i].alpha += ac_score + lm_score;
    }
  }

  /* initialise overall log-likelihood */
  lat->prob = LOG_ZERO;

  /* step backward */
  for (i=lat->n_arcs-1; i>=0 ;i--) {
    /* initialise beta */
    lat->arc[i].beta = LOG_ZERO;

    if (lat->arc[i].good_arc == 1) {
      /* get the acoustic and lm socre for a word hypothesis */
      ac_score = lat->arc[i].ac_score / lm_scale;
      lm_score = lat->arc[i].lm_score;

      /* compute beta */
      for (j=0; j<lat->arc[i].n_next_arcs; j++) {
	id = lat->arc[i].next_arcs[j];
	if (id == 0) {
	  lat->arc[i].beta = log_add(lat->arc[i].beta, 0);
	}
	else {
	  if (lat->arc[id-1].good_arc == 1)
        ;
	  lat->arc[i].beta = log_add(lat->arc[i].beta, lat->arc[id-1].beta);
	}
      }
      lat->arc[i].beta += ac_score + lm_score;

      /* compute overall log-likelihood loglid=beta(1)=alpha(Q) */
      if (lat->arc[i].sf == 1)
	lat->prob = log_add(lat->prob, lat->arc[i].beta);
    }
  }

  /* compute gamma */
  for (i=0; i<lat->n_arcs; i++)
    {
      /* initialise gamma */
      lat->arc[i].gamma = LOG_ZERO;
      if (lat->arc[i].good_arc == 1)
	{
	  ac_score = lat->arc[i].ac_score / lm_scale;
	  lm_score = lat->arc[i].lm_score;
	  lat->arc[i].gamma = lat->arc[i].alpha + lat->arc[i].beta - (ac_score + lm_score + lat->prob);
	}
    }

  /* compute the posterior probability of the true path */
  lat->postprob = 0;
  for (i=lat->n_arcs-lat->n_true_arcs; i<lat->n_arcs; i++)
    lat->postprob += lat->arc[i].gamma;
  
  return S3_SUCCESS;
}